

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExportBuildFileGenerator.cxx
# Opt level: O2

pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
* __thiscall
cmExportBuildFileGenerator::FindBuildExportInfo
          (pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *__return_storage_ptr__,cmExportBuildFileGenerator *this,cmGlobalGenerator *gg,
          string *name)

{
  pointer pTVar1;
  pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *ppVar2;
  __type _Var3;
  _Base_ptr p_Var4;
  pointer pTVar5;
  pointer __lhs;
  long lVar6;
  long lVar7;
  vector<cmExportBuildFileGenerator::TargetExport,_std::allocator<cmExportBuildFileGenerator::TargetExport>_>
  targets;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  exportFiles;
  string ns;
  vector<cmExportBuildFileGenerator::TargetExport,_std::allocator<cmExportBuildFileGenerator::TargetExport>_>
  local_b8;
  pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_a0;
  _Rb_tree_node_base *local_98;
  _Rb_tree_node_base *local_90;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string local_50 [32];
  
  local_88.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  local_70._M_string_length = 0;
  local_88.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_88.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_70.field_2._M_local_buf[0] = '\0';
  p_Var4 = (gg->BuildExportSets)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  local_98 = &(gg->BuildExportSets)._M_t._M_impl.super__Rb_tree_header._M_header;
  local_a0 = __return_storage_ptr__;
  do {
    ppVar2 = local_a0;
    if (p_Var4 == local_98) {
      std::
      pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::
      pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_true>
                (local_a0,&local_88,&local_70);
      std::__cxx11::string::~string((string *)&local_70);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_88);
      return ppVar2;
    }
    local_b8.
    super__Vector_base<cmExportBuildFileGenerator::TargetExport,_std::allocator<cmExportBuildFileGenerator::TargetExport>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_b8.
    super__Vector_base<cmExportBuildFileGenerator::TargetExport,_std::allocator<cmExportBuildFileGenerator::TargetExport>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_b8.
    super__Vector_base<cmExportBuildFileGenerator::TargetExport,_std::allocator<cmExportBuildFileGenerator::TargetExport>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    GetTargets(*(cmExportBuildFileGenerator **)(p_Var4 + 2),&local_b8);
    pTVar1 = local_b8.
             super__Vector_base<cmExportBuildFileGenerator::TargetExport,_std::allocator<cmExportBuildFileGenerator::TargetExport>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    local_90 = p_Var4 + 1;
    lVar6 = (long)local_b8.
                  super__Vector_base<cmExportBuildFileGenerator::TargetExport,_std::allocator<cmExportBuildFileGenerator::TargetExport>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)local_b8.
                  super__Vector_base<cmExportBuildFileGenerator::TargetExport,_std::allocator<cmExportBuildFileGenerator::TargetExport>_>
                  ._M_impl.super__Vector_impl_data._M_start;
    __lhs = local_b8.
            super__Vector_base<cmExportBuildFileGenerator::TargetExport,_std::allocator<cmExportBuildFileGenerator::TargetExport>_>
            ._M_impl.super__Vector_impl_data._M_start;
    for (lVar7 = lVar6 >> 8; pTVar5 = __lhs, 0 < lVar7; lVar7 = lVar7 + -1) {
      _Var3 = std::operator==(&__lhs->Name,name);
      if (_Var3) goto LAB_003d6916;
      _Var3 = std::operator==(&__lhs[1].Name,name);
      pTVar5 = __lhs + 1;
      if (_Var3) goto LAB_003d6916;
      _Var3 = std::operator==(&__lhs[2].Name,name);
      pTVar5 = __lhs + 2;
      if (_Var3) goto LAB_003d6916;
      _Var3 = std::operator==(&__lhs[3].Name,name);
      pTVar5 = __lhs + 3;
      if (_Var3) goto LAB_003d6916;
      __lhs = __lhs + 4;
      lVar6 = lVar6 + -0x100;
    }
    lVar6 = lVar6 >> 6;
    if (lVar6 == 1) {
LAB_003d6994:
      _Var3 = std::operator==(&__lhs->Name,name);
      pTVar5 = __lhs;
      if (!_Var3) {
        pTVar5 = pTVar1;
      }
LAB_003d6916:
      if (pTVar5 != pTVar1) {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(&local_88,(value_type *)local_90);
        std::__cxx11::string::string(local_50,(string *)(*(long *)(p_Var4 + 2) + 8));
        std::__cxx11::string::operator=((string *)&local_70,local_50);
        std::__cxx11::string::~string(local_50);
      }
    }
    else {
      if (lVar6 == 2) {
LAB_003d697c:
        _Var3 = std::operator==(&__lhs->Name,name);
        pTVar5 = __lhs;
        if (!_Var3) {
          __lhs = __lhs + 1;
          goto LAB_003d6994;
        }
        goto LAB_003d6916;
      }
      if (lVar6 == 3) {
        _Var3 = std::operator==(&__lhs->Name,name);
        if (!_Var3) {
          __lhs = __lhs + 1;
          goto LAB_003d697c;
        }
        goto LAB_003d6916;
      }
    }
    std::
    vector<cmExportBuildFileGenerator::TargetExport,_std::allocator<cmExportBuildFileGenerator::TargetExport>_>
    ::~vector(&local_b8);
    p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4);
  } while( true );
}

Assistant:

std::pair<std::vector<std::string>, std::string>
cmExportBuildFileGenerator::FindBuildExportInfo(cmGlobalGenerator* gg,
                                                const std::string& name)
{
  std::vector<std::string> exportFiles;
  std::string ns;

  auto& exportSets = gg->GetBuildExportSets();

  for (auto const& exp : exportSets) {
    const auto& exportSet = exp.second;
    std::vector<TargetExport> targets;
    exportSet->GetTargets(targets);
    if (std::any_of(
          targets.begin(), targets.end(),
          [&name](const TargetExport& te) { return te.Name == name; })) {
      exportFiles.push_back(exp.first);
      ns = exportSet->GetNamespace();
    }
  }

  return { exportFiles, ns };
}